

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O0

void destroyFallbackEdge(_GLFWfallbackEdgeWayland *edge)

{
  long *in_RDI;
  
  if (in_RDI[1] != 0) {
    wl_subsurface_destroy((wl_subsurface *)edge);
  }
  if (*in_RDI != 0) {
    wl_surface_destroy((wl_surface *)edge);
  }
  if (in_RDI[2] != 0) {
    wp_viewport_destroy((wp_viewport *)edge);
  }
  *in_RDI = 0;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  return;
}

Assistant:

static void destroyFallbackEdge(_GLFWfallbackEdgeWayland* edge)
{
    if (edge->subsurface)
        wl_subsurface_destroy(edge->subsurface);
    if (edge->surface)
        wl_surface_destroy(edge->surface);
    if (edge->viewport)
        wp_viewport_destroy(edge->viewport);

    edge->surface = NULL;
    edge->subsurface = NULL;
    edge->viewport = NULL;
}